

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.cxx
# Opt level: O2

void cmUVPipeBuffer::UVData(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  cmUVPipeBuffer *this;
  char *pcVar1;
  long __args;
  cmRange<const_char_*> __args_00;
  _Any_data local_28;
  _Manager_type local_18;
  _Invoker_type p_Stack_10;
  
  this = (cmUVPipeBuffer *)stream->data;
  if (nread < 1) {
    if (nread < 0) {
      local_28._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(this->EndFunction_).super__Function_base._M_functor;
      local_28._8_8_ =
           *(undefined8 *)((long)&(this->EndFunction_).super__Function_base._M_functor + 8);
      *(undefined8 *)&(this->EndFunction_).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(this->EndFunction_).super__Function_base._M_functor + 8) = 0;
      local_18 = (this->EndFunction_).super__Function_base._M_manager;
      p_Stack_10 = (this->EndFunction_)._M_invoker;
      (this->EndFunction_).super__Function_base._M_manager = (_Manager_type)0x0;
      (this->EndFunction_)._M_invoker = (_Invoker_type)0x0;
      reset(this);
      __args = 0;
      if (nread != -0xfff) {
        __args = nread;
      }
      std::function<void_(long)>::operator()((function<void_(long)> *)&local_28,__args);
      std::_Function_base::~_Function_base((_Function_base *)&local_28);
    }
  }
  else {
    pcVar1 = buf->base;
    if (pcVar1 != (char *)0x0) {
      __args_00.End = pcVar1 + nread;
      __args_00.Begin = pcVar1;
      std::function<void_(cmRange<const_char_*>)>::operator()(&this->DataFunction_,__args_00);
      return;
    }
  }
  return;
}

Assistant:

void cmUVPipeBuffer::UVData(uv_stream_t* stream, ssize_t nread,
                            const uv_buf_t* buf)
{
  auto& pipe = *reinterpret_cast<cmUVPipeBuffer*>(stream->data);
  if (nread > 0) {
    if (buf->base != nullptr) {
      // Call data function
      pipe.DataFunction_(DataRange(buf->base, buf->base + nread));
    }
  } else if (nread < 0) {
    // Save the end function on the stack before resetting the pipe
    EndFunction efunc;
    efunc.swap(pipe.EndFunction_);
    // Reset pipe before calling the end function
    pipe.reset();
    // Call end function
    efunc((nread == UV_EOF) ? 0 : nread);
  }
}